

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalTypeOptimization.cpp
# Opt level: O2

void __thiscall
wasm::(anonymous_namespace)::GlobalTypeOptimization::removeFieldsInInstructions(wasm::Module&)::
FieldRemover::FieldRemover(wasm::(anonymous)::GlobalTypeOptimization__
          (FieldRemover *this,GlobalTypeOptimization *parent)

{
  (this->super_WalkerPass<wasm::PostWalker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>_>).
  super_Pass.runner = (PassRunner *)0x0;
  (this->super_WalkerPass<wasm::PostWalker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>_>).
  super_Pass.name._M_dataplus._M_p =
       (pointer)&(this->
                 super_WalkerPass<wasm::PostWalker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>_>
                 ).super_Pass.name.field_2;
  (this->super_WalkerPass<wasm::PostWalker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>_>).
  super_Pass.name._M_string_length = 0;
  (this->super_WalkerPass<wasm::PostWalker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>_>).
  super_Pass.name.field_2._M_local_buf[0] = '\0';
  *(bool *)((long)&(this->
                   super_WalkerPass<wasm::PostWalker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>_>
                   ).super_Pass.passArg.
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           + 0x20) = false;
  (this->super_WalkerPass<wasm::PostWalker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>_>).
  super_PostWalker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>.
  super_Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>.replacep = (Expression **)0x0;
  (this->super_WalkerPass<wasm::PostWalker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>_>).
  super_PostWalker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>.
  super_Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>.stack.usedFixed = 0;
  (this->super_WalkerPass<wasm::PostWalker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>_>).
  super_PostWalker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>.
  super_Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>::Task,_std::allocator<wasm::Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->
           super_WalkerPass<wasm::PostWalker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>_>).
           super_PostWalker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>.
           super_Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>.stack.flexible.
           super__Vector_base<wasm::Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>::Task,_std::allocator<wasm::Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>::Task>_>
           ._M_impl + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->
           super_WalkerPass<wasm::PostWalker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>_>).
           super_PostWalker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>.
           super_Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>.stack.flexible.
           super__Vector_base<wasm::Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>::Task,_std::allocator<wasm::Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>::Task>_>
           ._M_impl + 0x10) = (pointer)0x0;
  (this->super_WalkerPass<wasm::PostWalker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>_>).
  super_PostWalker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>.
  super_Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>.currFunction = (Function *)0x0;
  (this->super_WalkerPass<wasm::PostWalker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>_>).
  super_PostWalker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>.
  super_Walker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>.currModule = (Module *)0x0;
  (this->super_WalkerPass<wasm::PostWalker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>_>).
  super_Pass._vptr_Pass = (_func_int **)&PTR__WalkerPass_01121440;
  this->parent = parent;
  this->needEHFixups = false;
  return;
}

Assistant:

FieldRemover(GlobalTypeOptimization& parent) : parent(parent) {}